

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O1

Matrix2f operator*(Matrix2f *x,Matrix2f *y)

{
  float fVar1;
  undefined1 auVar2 [16];
  Matrix2f *product;
  undefined8 *in_RDI;
  long lVar3;
  float *pfVar4;
  long lVar5;
  int k;
  long lVar6;
  bool bVar7;
  Matrix2f MVar8;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  lVar3 = 0;
  do {
    pfVar4 = y->m_elements;
    lVar5 = 0;
    do {
      fVar1 = x->m_elements[lVar3 + lVar5 * 2];
      lVar6 = 0;
      do {
        auVar2 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[lVar6 * 2]),ZEXT416((uint)fVar1),
                                 ZEXT416(*(uint *)(in_RDI + lVar6)));
        *(int *)(in_RDI + lVar6) = auVar2._0_4_;
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      pfVar4 = pfVar4 + 1;
      bVar7 = lVar5 == 0;
      lVar5 = lVar5 + 1;
    } while (bVar7);
    in_RDI = (undefined8 *)((long)in_RDI + 4);
    bVar7 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar7);
  MVar8.m_elements[1] = 0.0;
  MVar8.m_elements[0] = fVar1;
  MVar8.m_elements._8_8_ = auVar2._0_8_;
  return (Matrix2f)MVar8.m_elements;
}

Assistant:

Matrix2f operator * ( const Matrix2f& x, const Matrix2f& y )
{
	Matrix2f product; // zeroes

	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			for( int k = 0; k < 2; ++k )
			{
				product( i, k ) += x( i, j ) * y( j, k );
			}
		}
	}

	return product;
}